

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FreeIndex(sqlite3 *db,Index *p)

{
  sqlite3 *in_RSI;
  sqlite3 *in_RDI;
  Expr *in_stack_ffffffffffffffe8;
  
  sqlite3DeleteIndexSamples(in_RDI,(Index *)in_RSI);
  sqlite3ExprDelete(in_RSI,in_stack_ffffffffffffffe8);
  sqlite3ExprListDelete(in_RSI,(ExprList *)in_stack_ffffffffffffffe8);
  sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  if ((*(ushort *)((long)&in_RSI->dbOptFlags + 3) >> 4 & 1) != 0) {
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  }
  sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FreeIndex(sqlite3 *db, Index *p){
#ifndef SQLITE_OMIT_ANALYZE
  sqlite3DeleteIndexSamples(db, p);
#endif
  sqlite3ExprDelete(db, p->pPartIdxWhere);
  sqlite3ExprListDelete(db, p->aColExpr);
  sqlite3DbFree(db, p->zColAff);
  if( p->isResized ) sqlite3DbFree(db, (void *)p->azColl);
#ifdef SQLITE_ENABLE_STAT4
  sqlite3_free(p->aiRowEst);
#endif
  sqlite3DbFree(db, p);
}